

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O1

bool cal_run(void)

{
  pointer pGVar1;
  bool bVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  pointer pGVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  pointer pGVar20;
  pointer pPVar21;
  pointer pPVar22;
  uint uVar23;
  duration dVar24;
  ulong uVar25;
  ostream *poVar26;
  uint gridSz;
  ulong uVar27;
  int iVar28;
  long lVar29;
  pointer pGVar30;
  __normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_> __last;
  pointer pGVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  size_t __n;
  int iVar35;
  __normal_iterator<Grid_*,_std::vector<Grid,_std::allocator<Grid>_>_> __i;
  pointer pGVar36;
  float fVar37;
  float fVar38;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  
  dVar24.__r = std::chrono::_V2::system_clock::now();
  pGVar20 = gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  pGVar36 = gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data.
            _M_start;
  uVar27 = ((long)gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar23 = (int)((long)planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x49249249;
  lVar29 = (long)gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                 super__Vector_impl_data._M_start;
  logtime.__d.__r = (duration)(duration)dVar24.__r;
  if (gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar33 = 0x3f;
    if (uVar27 != 0) {
      for (; uVar27 >> lVar33 == 0; lVar33 = lVar33 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Grid*,std::vector<Grid,std::allocator<Grid>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Grid_const&,Grid_const&)>>
              ((__normal_iterator<Grid_*,_std::vector<Grid,_std::allocator<Grid>_>_>)
               gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<Grid_*,_std::vector<Grid,_std::allocator<Grid>_>_>)
               gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
               super__Vector_impl_data._M_finish,(ulong)(((uint)lVar33 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Grid_&,_const_Grid_&)>)0x10b3a7);
    pGVar30 = pGVar36;
    if (lVar29 < 0x181) {
      while (pGVar31 = pGVar30 + 1, pGVar31 != pGVar20) {
        iVar28 = pGVar31->gridSize;
        if (pGVar36->gridSize < iVar28) {
          iVar28 = pGVar31->carrierAtk;
          iVar35 = pGVar31->isFighterOnly;
          uVar12 = pGVar31->carrierPos;
          uVar13 = pGVar31->gridPos;
          uVar14 = pGVar31->gridSize;
          uVar15 = pGVar31->gridSizeFsb;
          memmove((void *)((long)pGVar30 + (0x30 - ((long)pGVar31 - (long)pGVar36))),pGVar36,
                  (long)pGVar31 - (long)pGVar36);
          pGVar36->carrierPos = uVar12;
          pGVar36->gridPos = uVar13;
          pGVar36->gridSize = uVar14;
          pGVar36->gridSizeFsb = uVar15;
          pGVar36->carrierAtk = iVar28;
          pGVar36->isFighterOnly = iVar35;
          pGVar30 = pGVar31;
        }
        else {
          iVar34 = pGVar31->carrierPos;
          iVar17 = pGVar31->gridPos;
          iVar18 = pGVar31->gridSizeFsb;
          iVar19 = pGVar31->carrierAtk;
          iVar32 = pGVar31->isFighterOnly;
          iVar35 = pGVar30->gridSize;
          pGVar30 = pGVar31;
          while (iVar35 < iVar28) {
            iVar35 = pGVar30[-1].isFighterOnly;
            pGVar30->carrierAtk = pGVar30[-1].carrierAtk;
            pGVar30->isFighterOnly = iVar35;
            iVar35 = pGVar30[-1].gridPos;
            iVar6 = pGVar30[-1].gridSize;
            iVar7 = pGVar30[-1].gridSizeFsb;
            pGVar30->carrierPos = pGVar30[-1].carrierPos;
            pGVar30->gridPos = iVar35;
            pGVar30->gridSize = iVar6;
            pGVar30->gridSizeFsb = iVar7;
            iVar35 = pGVar30[-2].gridSize;
            pGVar30 = pGVar30 + -1;
          }
          pGVar30->carrierPos = iVar34;
          pGVar30->gridPos = iVar17;
          pGVar30->gridSize = iVar28;
          pGVar30->gridSizeFsb = iVar18;
          pGVar30->carrierAtk = iVar19;
          pGVar30->isFighterOnly = iVar32;
          pGVar30 = pGVar31;
        }
      }
    }
    else {
      __n = 0x18;
      pGVar31 = pGVar36;
      do {
        pGVar30 = pGVar30 + 1;
        pGVar1 = (pointer)((long)&pGVar36->carrierPos + __n);
        iVar28 = *(int *)((long)&pGVar36->gridSize + __n);
        if (pGVar36->gridSize < iVar28) {
          iVar28 = pGVar1->carrierAtk;
          iVar35 = pGVar1->isFighterOnly;
          uVar8 = pGVar1->carrierPos;
          uVar9 = pGVar1->gridPos;
          uVar10 = pGVar1->gridSize;
          uVar11 = pGVar1->gridSizeFsb;
          memmove((void *)((long)pGVar31 + (0x30 - __n)),pGVar36,__n);
          pGVar36->carrierPos = uVar8;
          pGVar36->gridPos = uVar9;
          pGVar36->gridSize = uVar10;
          pGVar36->gridSizeFsb = uVar11;
          pGVar36->carrierAtk = iVar28;
          pGVar36->isFighterOnly = iVar35;
        }
        else {
          iVar34 = pGVar1->carrierPos;
          iVar17 = pGVar1->gridPos;
          iVar18 = pGVar1->gridSizeFsb;
          iVar19 = pGVar1->carrierAtk;
          iVar32 = pGVar1->isFighterOnly;
          iVar35 = pGVar31->gridSize;
          pGVar31 = pGVar1;
          pGVar16 = pGVar30;
          while (iVar35 < iVar28) {
            pGVar31 = pGVar16 + -1;
            iVar35 = pGVar16[-1].isFighterOnly;
            pGVar16->carrierAtk = pGVar16[-1].carrierAtk;
            pGVar16->isFighterOnly = iVar35;
            iVar35 = pGVar16[-1].gridPos;
            iVar6 = pGVar16[-1].gridSize;
            iVar7 = pGVar16[-1].gridSizeFsb;
            pGVar16->carrierPos = pGVar16[-1].carrierPos;
            pGVar16->gridPos = iVar35;
            pGVar16->gridSize = iVar6;
            pGVar16->gridSizeFsb = iVar7;
            iVar35 = pGVar16[-2].gridSize;
            pGVar16 = pGVar31;
          }
          pGVar31->carrierPos = iVar34;
          pGVar31->gridPos = iVar17;
          pGVar31->gridSize = iVar28;
          pGVar31->gridSizeFsb = iVar18;
          pGVar31->carrierAtk = iVar19;
          pGVar31->isFighterOnly = iVar32;
        }
        __n = __n + 0x18;
        pGVar31 = pGVar1;
      } while (__n != 0x180);
      for (pGVar36 = pGVar36 + 0x10; pGVar36 != pGVar20; pGVar36 = pGVar36 + 1) {
        iVar34 = pGVar36->carrierPos;
        iVar17 = pGVar36->gridPos;
        iVar35 = pGVar36->gridSize;
        iVar32 = pGVar36->isFighterOnly;
        iVar18 = pGVar36->gridSizeFsb;
        iVar19 = pGVar36->carrierAtk;
        iVar28 = pGVar36[-1].gridSize;
        pGVar30 = pGVar36;
        while (iVar28 < iVar35) {
          iVar28 = pGVar30[-1].isFighterOnly;
          pGVar30->carrierAtk = pGVar30[-1].carrierAtk;
          pGVar30->isFighterOnly = iVar28;
          iVar28 = pGVar30[-1].gridPos;
          iVar6 = pGVar30[-1].gridSize;
          iVar7 = pGVar30[-1].gridSizeFsb;
          pGVar30->carrierPos = pGVar30[-1].carrierPos;
          pGVar30->gridPos = iVar28;
          pGVar30->gridSize = iVar6;
          pGVar30->gridSizeFsb = iVar7;
          iVar28 = pGVar30[-2].gridSize;
          pGVar30 = pGVar30 + -1;
        }
        pGVar30->carrierPos = iVar34;
        pGVar30->gridPos = iVar17;
        pGVar30->gridSize = iVar35;
        pGVar30->gridSizeFsb = iVar18;
        pGVar30->carrierAtk = iVar19;
        pGVar30->isFighterOnly = iVar32;
      }
    }
  }
  pPVar22 = planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pPVar21 = planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar25 = ((long)planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    lVar29 = 0x3f;
    if (uVar25 != 0) {
      for (; uVar25 >> lVar29 == 0; lVar29 = lVar29 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
              ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
               planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
               planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
               super__Vector_impl_data._M_finish,(ulong)(((uint)lVar29 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10b3b1);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
              ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)pPVar21,
               (__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)pPVar22,
               (_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10b3b1);
  }
  iVar28 = -(uint)(0x32 < tarAirSupremacy);
  gridSz = (uint)uVar27;
  uVar4 = uVar23;
  if ((int)gridSz < (int)uVar23) {
    uVar4 = gridSz;
  }
  if (0 < (int)uVar4) {
    fVar38 = 50.0;
    lVar29 = 8;
    iVar35 = 1;
    lVar33 = 0;
    do {
      iVar32 = *(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                                super__Vector_impl_data._M_start)->airSupremacy + lVar33);
      iVar34 = 3;
      if (*(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                           super__Vector_impl_data._M_start)->category + lVar33) == 3) {
        iVar34 = 0x19;
      }
      dVar3 = (double)*(int *)((long)&(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->carrierPos +
                              lVar29);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      fVar38 = fVar38 + (float)(iVar34 + (int)((double)iVar32 * dVar3));
      iVar32 = iVar28;
      if (iVar28 == -1) {
        iVar32 = iVar35;
      }
      if (fVar38 < (float)tarAirSupremacy) {
        iVar32 = iVar28;
      }
      iVar28 = iVar32;
      lVar33 = lVar33 + 0x38;
      lVar29 = lVar29 + 0x18;
      iVar35 = iVar35 + 1;
    } while ((ulong)uVar4 * 0x38 != lVar33);
  }
  uVar5 = uVar23;
  if ((int)gridSz < (int)uVar23) {
    uVar5 = gridSz;
  }
  if ((int)uVar5 < 1) {
    fVar38 = 0.0;
    iVar35 = 0;
  }
  else {
    lVar29 = 0;
    fVar38 = 0.0;
    lVar33 = 8;
    iVar35 = 0;
    do {
      if (*(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                           super__Vector_impl_data._M_start)->category + lVar29) == 3) {
        iVar35 = iVar35 + 1;
        std::vector<Plane,_std::allocator<Plane>_>::push_back
                  (&planeVecF,
                   (value_type *)
                   ((long)&((planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                             super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar29));
      }
      iVar32 = *(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                                super__Vector_impl_data._M_start)->airSupremacy + lVar29);
      iVar34 = 3;
      if (*(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                           super__Vector_impl_data._M_start)->category + lVar29) == 3) {
        iVar34 = 0x19;
      }
      dVar3 = (double)*(int *)((long)&(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->carrierPos +
                              lVar33);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      fVar38 = fVar38 + (float)(iVar34 + (int)((double)iVar32 * dVar3));
      lVar29 = lVar29 + 0x38;
      lVar33 = lVar33 + 0x18;
    } while ((ulong)uVar4 * 0x38 != lVar29);
  }
  fVar37 = (float)tarAirSupremacy;
  if (fVar38 < fVar37) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ERROR:FighterPower unreachable.Currently reachable FighterPower: ",0x41);
    poVar26 = std::ostream::_M_insert<double>((double)fVar38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar26 + -0x18) + (char)poVar26);
    std::ostream::put((char)poVar26);
    std::ostream::flush();
  }
  else {
    iVar32 = 0x10;
    if (iVar35 < 0x10) {
      iVar32 = iVar35;
    }
    if (iVar32 < iVar28) {
      iVar28 = iVar32;
    }
    curFighterNum = iVar28;
    do {
      std::vector<Plane,_std::allocator<Plane>_>::clear(&planeVecA);
      if (0 < (int)uVar23) {
        lVar29 = 0;
        uVar27 = (ulong)(uVar23 & 0x7fffffff);
        do {
          if (*(int *)((long)&(planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                               super__Vector_impl_data._M_start)->category + lVar29) - 1U < 2) {
            std::vector<Plane,_std::allocator<Plane>_>::push_back
                      (&planeVecA,
                       (value_type *)
                       ((long)&((planeVec.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                                 super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar29)
                      );
          }
          lVar29 = lVar29 + 0x38;
          uVar27 = uVar27 - 1;
        } while (uVar27 != 0);
      }
      pPVar22 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pPVar21 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
          super__Vector_impl_data._M_start !=
          planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar27 = ((long)planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        lVar29 = 0x3f;
        if (uVar27 != 0) {
          for (; uVar27 >> lVar29 == 0; lVar29 = lVar29 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
                  ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                   planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                   planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                   super__Vector_impl_data._M_finish,(ulong)(((uint)lVar29 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10b411);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
                  ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)pPVar21,
                   (__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)pPVar22,
                   (_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10b411);
      }
      pPVar21 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                super__Vector_impl_data._M_start;
      curBomberNum = gridSz - curFighterNum;
      iVar35 = (int)((ulong)((long)planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar28 = iVar35 * -0x49249249;
      if (SBORROW4(curBomberNum,iVar28) == curBomberNum + iVar35 * 0x49249249 < 0) {
        curBomberNum = iVar28;
      }
      if (attackerAbleGridNum < curBomberNum) {
        curBomberNum = attackerAbleGridNum;
      }
      flushFlag = true;
      if (curBomberNum != 0) {
        uVar27 = (ulong)curBomberNum;
        __last._M_current =
             planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
             super__Vector_impl_data._M_start + uVar27;
        lVar29 = 0x3f;
        if (uVar27 != 0) {
          for (; uVar27 >> lVar29 == 0; lVar29 = lVar29 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
                  ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                   planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                   super__Vector_impl_data._M_start,__last,(ulong)(((uint)lVar29 ^ 0x3f) * 2) ^ 0x7e
                   ,(_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10b5e8);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Plane_const&,Plane_const&)>>
                  ((__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)pPVar21,
                   __last,(_Iter_comp_iter<bool_(*)(const_Plane_&,_const_Plane_&)>)0x10b5e8);
      }
      atkdp(curBomberNum);
      sign[0x1c] = 0;
      sign[0x1d] = 0;
      sign[0x1e] = 0;
      sign[0x1f] = 0;
      sign[0x18] = 0;
      sign[0x19] = 0;
      sign[0x1a] = 0;
      sign[0x1b] = 0;
      sign[0x14] = 0;
      sign[0x15] = 0;
      sign[0x16] = 0;
      sign[0x17] = 0;
      sign[0x10] = 0;
      sign[0x11] = 0;
      sign[0x12] = 0;
      sign[0x13] = 0;
      sign[0xc] = 0;
      sign[0xd] = 0;
      sign[0xe] = 0;
      sign[0xf] = 0;
      sign[8] = 0;
      sign[9] = 0;
      sign[10] = 0;
      sign[0xb] = 0;
      sign[4] = 0;
      sign[5] = 0;
      sign[6] = 0;
      sign[7] = 0;
      sign[0] = 0;
      sign[1] = 0;
      sign[2] = 0;
      sign[3] = 0;
      baoliSearch(0,curFighterNum,curBomberNum,gridSz);
      iVar28 = curFighterNum + 1;
      bVar2 = curFighterNum < iVar32;
      curFighterNum = iVar28;
    } while (bVar2);
    lVar29 = std::chrono::_V2::system_clock::now();
    restime.__r = (lVar29 - dVar24.__r) / 1000;
  }
  return fVar37 <= fVar38;
}

Assistant:

bool cal_run(){//if available result
    auto starttime=std::chrono::system_clock::now();
    logtime=starttime;
    //prepare
    int gridSz=gridVec.size(),planeSz=planeVec.size();
    sort(gridVec.begin(),gridVec.end(),cal_cmp_grid);

    //choose fighters.
    int minFighterNum=-1,maxFighterNum=0;

    sort(planeVec.begin(),planeVec.end(),cal_cmp_plane_AS);

    //cal min
    float tAS=PRESET_AS_OF_BOMBER;//AirSupermacy Val
    if(tAS>=tarAirSupremacy)minFighterNum=0;
    for(int i=0;i<gridSz&&i<planeSz;i++){
        tAS+=AS_PROF_BONOUS(planeVec[i])+formulaFighter(gridVec[i].gridSize,planeVec[i].airSupremacy);
        if(tAS>=tarAirSupremacy&&minFighterNum==-1){
            minFighterNum=i+1;
        }
    }
    //cal max
    tAS=0;
    for(int i=0;i<gridSz&&i<planeSz;i++){
        if(planeVec[i].category == PLANE_FIGHTER){
            maxFighterNum++;
            planeVecF.push_back(planeVec[i]);
        }
        tAS+=AS_PROF_BONOUS(planeVec[i])+formulaFighter(gridVec[i].gridSize,planeVec[i].airSupremacy);
    }
    if(tAS<tarAirSupremacy){
        cout<<"ERROR:FighterPower unreachable.Currently reachable FighterPower: "<<tAS<<endl;
        return false;
    }
    maxFighterNum=min(maxFighterNum,16);
    minFighterNum = min(minFighterNum, maxFighterNum);

    //for all possibility
    for(curFighterNum=minFighterNum;curFighterNum<=maxFighterNum;curFighterNum++){
        //choose bombers.
        planeVecA.clear();
        for(int i=0;i<planeSz;i++){
            Plane &tplane=planeVec[i];
            if(tplane.category==PLANE_BOMBER||tplane.category==PLANE_TORPEDO_ATTACKER)
                planeVecA.push_back(tplane);
        }
        sort(planeVecA.begin(),planeVecA.end(),cal_cmp_plane_damage);
        curBomberNum=min(gridSz-curFighterNum,(int)planeVecA.size());
        curBomberNum=min(curBomberNum,attackerAbleGridNum);
        flushFlag=1;//if copy resVecA
//        cout<<curBomberNum<<endl;
//        if(curBomberNum>CBN_LIMIT){
//            cout<<"ERROR:Too much bomber, curBomberNum: "<<curBomberNum<<"  LIMIT: "<<CBN_LIMIT-1<<endl;
//            return false;
//        }

//        cout<<curBomberNum<<endl;
        sort(planeVecA.begin(),planeVecA.begin()+curBomberNum,cal_cmp_plane_damageOP);

        //dfs all bombers assignments
        atkdp(curBomberNum);
//        cout<<"dp finished"<<endl;
        // 0-1 search
        memset(sign,0,sizeof(sign));
        baoliSearch(0,curFighterNum,curBomberNum,gridSz);
    }
    restime=std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::system_clock::now() - starttime);

    return true;
}